

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O0

base_learner * active_setup(options_i *options,vw *all)

{
  byte bVar1;
  pointer paVar2;
  undefined8 uVar3;
  vw *in_RSI;
  long *in_RDI;
  learner<active,_example> *l;
  single_learner *base;
  stringstream __msg;
  option_group_definition new_options;
  bool simulation;
  bool active_option;
  free_ptr<active> data;
  typed_option<float> *in_stack_fffffffffffff7c8;
  vw *in_stack_fffffffffffff7d0;
  string *in_stack_fffffffffffff7d8;
  undefined7 in_stack_fffffffffffff7e0;
  byte in_stack_fffffffffffff7e7;
  string *in_stack_fffffffffffff7e8;
  undefined8 in_stack_fffffffffffff7f0;
  int plineNumber;
  allocator *paVar4;
  char *in_stack_fffffffffffff7f8;
  vw_exception *in_stack_fffffffffffff800;
  typed_option<float> *in_stack_fffffffffffff818;
  vw *pvVar5;
  option_group_definition *in_stack_fffffffffffff820;
  long *plVar6;
  allocator local_759;
  string local_758 [32];
  vw *local_738;
  single_learner *local_730;
  undefined1 local_721;
  stringstream local_700 [16];
  stringstream local_6f0 [128];
  learner<char,_char> *in_stack_fffffffffffff990;
  allocator local_571;
  string local_570 [32];
  undefined4 local_550;
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [359];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [359];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  typed_option<bool> local_1e0 [2];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [62];
  undefined1 local_2a;
  byte local_29;
  vw *local_18;
  long *local_10;
  base_learner *local_8;
  
  plineNumber = (int)((ulong)in_stack_fffffffffffff7f0 >> 0x20);
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<active>();
  local_29 = 0;
  local_2a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Active Learning",&local_89);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff7d0,
             (string *)in_stack_fffffffffffff7c8);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"active",&local_201);
  VW::config::make_option<bool>(in_stack_fffffffffffff7d8,(bool *)in_stack_fffffffffffff7d0);
  VW::config::typed_option<bool>::keep(local_1e0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"enable active learning",&local_229);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff7d0,(string *)in_stack_fffffffffffff7c8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff7d0,
             (typed_option<bool> *)in_stack_fffffffffffff7c8);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff820,(typed_option<bool> *)in_stack_fffffffffffff818);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"simulation",&local_391);
  VW::config::make_option<bool>(in_stack_fffffffffffff7d8,(bool *)in_stack_fffffffffffff7d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"active learning simulation mode",&local_3b9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff7d0,(string *)in_stack_fffffffffffff7c8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff7d0,
             (typed_option<bool> *)in_stack_fffffffffffff7c8);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff820,(typed_option<bool> *)in_stack_fffffffffffff818);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"mellowness",&local_521);
  std::unique_ptr<active,_void_(*)(void_*)>::operator->
            ((unique_ptr<active,_void_(*)(void_*)> *)0x2abc88);
  VW::config::make_option<float>(in_stack_fffffffffffff7d8,(float *)in_stack_fffffffffffff7d0);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
             (float)((ulong)in_stack_fffffffffffff7d8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_548,"active learning mellowness parameter c_0. Default 8",&local_549);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff7d0,(string *)in_stack_fffffffffffff7c8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff820,in_stack_fffffffffffff818);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff7d0);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff7d0);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff7d0);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff7d0);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff7d0);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff7d0);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  (**(code **)*local_10)(local_10,local_68);
  if ((local_29 & 1) == 0) {
    local_8 = (base_learner *)0x0;
  }
  else {
    pvVar5 = local_18;
    paVar2 = std::unique_ptr<active,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active,_void_(*)(void_*)> *)0x2ac163);
    paVar2->all = pvVar5;
    plVar6 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_570,"lda",&local_571);
    bVar1 = (**(code **)(*plVar6 + 8))(plVar6,local_570);
    std::__cxx11::string::~string(local_570);
    std::allocator<char>::~allocator((allocator<char> *)&local_571);
    if ((bVar1 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_700);
      std::operator<<((ostream *)(local_700 + 0x10),
                      "error: you can\'t combine lda and active learning");
      local_721 = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,plineNumber,
                 in_stack_fffffffffffff7e8);
      local_721 = 0;
      __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    setup_base((options_i *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
    local_730 = LEARNER::as_singleline<char,char>(in_stack_fffffffffffff990);
    paVar4 = &local_759;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_758,"simulation",paVar4);
    in_stack_fffffffffffff7e7 = (**(code **)(*local_10 + 8))(local_10,local_758);
    std::__cxx11::string::~string(local_758);
    std::allocator<char>::~allocator((allocator<char> *)&local_759);
    if ((in_stack_fffffffffffff7e7 & 1) == 0) {
      local_18->active = true;
      in_stack_fffffffffffff7d0 =
           (vw *)LEARNER::init_learner<active,example,LEARNER::learner<char,example>>
                           ((free_ptr<active> *)
                            CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                            (learner<char,_example> *)in_stack_fffffffffffff7d8,
                            (_func_void_active_ptr_learner<char,_example>_ptr_example_ptr *)
                            in_stack_fffffffffffff7d0,
                            (_func_void_active_ptr_learner<char,_example>_ptr_example_ptr *)
                            in_stack_fffffffffffff7c8);
      local_738 = in_stack_fffffffffffff7d0;
      LEARNER::learner<active,_example>::set_finish_example
                ((learner<active,_example> *)in_stack_fffffffffffff7d0,return_active_example);
    }
    else {
      local_738 = (vw *)LEARNER::init_learner<active,example,LEARNER::learner<char,example>>
                                  ((free_ptr<active> *)
                                   CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                                   (learner<char,_example> *)in_stack_fffffffffffff7d8,
                                   (_func_void_active_ptr_learner<char,_example>_ptr_example_ptr *)
                                   in_stack_fffffffffffff7d0,
                                   (_func_void_active_ptr_learner<char,_example>_ptr_example_ptr *)
                                   in_stack_fffffffffffff7c8);
    }
    local_8 = LEARNER::make_base<active,example>((learner<active,_example> *)local_738);
  }
  local_550 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff7d0);
  std::unique_ptr<active,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<active,_void_(*)(void_*)> *)
             CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0));
  return local_8;
}

Assistant:

base_learner* active_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<active>();

  bool active_option = false;
  bool simulation = false;
  option_group_definition new_options("Active Learning");
  new_options.add(make_option("active", active_option).keep().help("enable active learning"))
      .add(make_option("simulation", simulation).help("active learning simulation mode"))
      .add(make_option("mellowness", data->active_c0)
               .default_value(8.f)
               .help("active learning mellowness parameter c_0. Default 8"));
  options.add_and_parse(new_options);

  if (!active_option)
    return nullptr;

  data->all = &all;

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  auto base = as_singleline(setup_base(options, all));

  // Create new learner
  learner<active, example>* l;
  if (options.was_supplied("simulation"))
    l = &init_learner(data, base, predict_or_learn_simulation<true>, predict_or_learn_simulation<false>);
  else
  {
    all.active = true;
    l = &init_learner(data, base, predict_or_learn_active<true>, predict_or_learn_active<false>);
    l->set_finish_example(return_active_example);
  }

  return make_base(*l);
}